

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O3

bool xmrig::OclLib::load(void)

{
  int iVar1;
  runtime_error *this;
  
  iVar1 = uv_dlsym(&oclLib,"clCreateCommandQueue",&pCreateCommandQueue);
  if (iVar1 == -1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"symbol not found");
  }
  else {
    iVar1 = uv_dlsym(&oclLib,"clCreateContext",&pCreateContext);
    if (iVar1 == -1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"symbol not found");
    }
    else {
      iVar1 = uv_dlsym(&oclLib,"clBuildProgram",&pBuildProgram);
      if (iVar1 == -1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"symbol not found");
      }
      else {
        iVar1 = uv_dlsym(&oclLib,"clEnqueueNDRangeKernel",&pEnqueueNDRangeKernel);
        if (iVar1 == -1) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"symbol not found");
        }
        else {
          iVar1 = uv_dlsym(&oclLib,"clEnqueueReadBuffer",&pEnqueueReadBuffer);
          if (iVar1 == -1) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"symbol not found");
          }
          else {
            iVar1 = uv_dlsym(&oclLib,"clEnqueueWriteBuffer",&pEnqueueWriteBuffer);
            if (iVar1 == -1) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this,"symbol not found");
            }
            else {
              iVar1 = uv_dlsym(&oclLib,"clFinish",&pFinish);
              if (iVar1 == -1) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this,"symbol not found");
              }
              else {
                iVar1 = uv_dlsym(&oclLib,"clGetDeviceIDs",&pGetDeviceIDs);
                if (iVar1 == -1) {
                  this = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this,"symbol not found");
                }
                else {
                  iVar1 = uv_dlsym(&oclLib,"clGetDeviceInfo",&pGetDeviceInfo);
                  if (iVar1 == -1) {
                    this = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this,"symbol not found");
                  }
                  else {
                    iVar1 = uv_dlsym(&oclLib,"clGetPlatformInfo",&pGetPlatformInfo);
                    if (iVar1 == -1) {
                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this,"symbol not found");
                    }
                    else {
                      iVar1 = uv_dlsym(&oclLib,"clGetPlatformIDs",&pGetPlatformIDs);
                      if (iVar1 == -1) {
                        this = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(this,"symbol not found");
                      }
                      else {
                        iVar1 = uv_dlsym(&oclLib,"clGetProgramBuildInfo",&pGetProgramBuildInfo);
                        if (iVar1 == -1) {
                          this = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this,"symbol not found");
                        }
                        else {
                          iVar1 = uv_dlsym(&oclLib,"clGetProgramInfo",&pGetProgramInfo);
                          if (iVar1 == -1) {
                            this = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error(this,"symbol not found");
                          }
                          else {
                            iVar1 = uv_dlsym(&oclLib,"clSetKernelArg",&pSetKernelArg);
                            if (iVar1 == -1) {
                              this = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error(this,"symbol not found");
                            }
                            else {
                              iVar1 = uv_dlsym(&oclLib,"clCreateKernel",&pCreateKernel);
                              if (iVar1 == -1) {
                                this = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error(this,"symbol not found");
                              }
                              else {
                                iVar1 = uv_dlsym(&oclLib,"clCreateBuffer",&pCreateBuffer);
                                if (iVar1 == -1) {
                                  this = (runtime_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error(this,"symbol not found");
                                }
                                else {
                                  iVar1 = uv_dlsym(&oclLib,"clCreateProgramWithBinary",
                                                   &pCreateProgramWithBinary);
                                  if (iVar1 == -1) {
                                    this = (runtime_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error(this,"symbol not found");
                                  }
                                  else {
                                    iVar1 = uv_dlsym(&oclLib,"clCreateProgramWithSource",
                                                     &pCreateProgramWithSource);
                                    if (iVar1 == -1) {
                                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                                      std::runtime_error::runtime_error(this,"symbol not found");
                                    }
                                    else {
                                      iVar1 = uv_dlsym(&oclLib,"clReleaseMemObject",
                                                       &pReleaseMemObject);
                                      if (iVar1 == -1) {
                                        this = (runtime_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error(this,"symbol not found");
                                      }
                                      else {
                                        iVar1 = uv_dlsym(&oclLib,"clReleaseProgram",&pReleaseProgram
                                                        );
                                        if (iVar1 == -1) {
                                          this = (runtime_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error(this,"symbol not found")
                                          ;
                                        }
                                        else {
                                          iVar1 = uv_dlsym(&oclLib,"clReleaseKernel",&pReleaseKernel
                                                          );
                                          if (iVar1 == -1) {
                                            this = (runtime_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      (this,"symbol not found");
                                          }
                                          else {
                                            iVar1 = uv_dlsym(&oclLib,"clReleaseCommandQueue",
                                                             &pReleaseCommandQueue);
                                            if (iVar1 == -1) {
                                              this = (runtime_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::runtime_error::runtime_error
                                                        (this,"symbol not found");
                                            }
                                            else {
                                              iVar1 = uv_dlsym(&oclLib,"clReleaseContext",
                                                               &pReleaseContext);
                                              if (iVar1 == -1) {
                                                this = (runtime_error *)
                                                       __cxa_allocate_exception(0x10);
                                                std::runtime_error::runtime_error
                                                          (this,"symbol not found");
                                              }
                                              else {
                                                iVar1 = uv_dlsym(&oclLib,"clGetKernelInfo",
                                                                 &pGetKernelInfo);
                                                if (iVar1 == -1) {
                                                  this = (runtime_error *)
                                                         __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            (this,"symbol not found");
                                                }
                                                else {
                                                  iVar1 = uv_dlsym(&oclLib,"clGetCommandQueueInfo",
                                                                   &pGetCommandQueueInfo);
                                                  if (iVar1 == -1) {
                                                    this = (runtime_error *)
                                                           __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              (this,"symbol not found");
                                                  }
                                                  else {
                                                    iVar1 = uv_dlsym(&oclLib,"clGetMemObjectInfo",
                                                                     &pGetMemObjectInfo);
                                                    if (iVar1 == -1) {
                                                      this = (runtime_error *)
                                                             __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                (this,"symbol not found");
                                                    }
                                                    else {
                                                      iVar1 = uv_dlsym(&oclLib,"clGetContextInfo",
                                                                       &pGetContextInfo);
                                                      if (iVar1 == -1) {
                                                        this = (runtime_error *)
                                                               __cxa_allocate_exception(0x10);
                                                        std::runtime_error::runtime_error
                                                                  (this,"symbol not found");
                                                      }
                                                      else {
                                                        iVar1 = uv_dlsym(&oclLib,"clReleaseDevice",
                                                                         &pReleaseDevice);
                                                        if (iVar1 == -1) {
                                                          this = (runtime_error *)
                                                                 __cxa_allocate_exception(0x10);
                                                          std::runtime_error::runtime_error
                                                                    (this,"symbol not found");
                                                        }
                                                        else {
                                                          iVar1 = uv_dlsym(&oclLib,
                                                  "clUnloadPlatformCompiler",
                                                  &pUnloadPlatformCompiler);
                                                  if (iVar1 == -1) {
                                                    this = (runtime_error *)
                                                           __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              (this,"symbol not found");
                                                  }
                                                  else {
                                                    iVar1 = uv_dlsym(&oclLib,
                                                  "clSetMemObjectDestructorCallback",
                                                  &pSetMemObjectDestructorCallback);
                                                  if (iVar1 == -1) {
                                                    this = (runtime_error *)
                                                           __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              (this,"symbol not found");
                                                  }
                                                  else {
                                                    iVar1 = uv_dlsym(&oclLib,"clCreateSubBuffer",
                                                                     &pCreateSubBuffer);
                                                    if (iVar1 == -1) {
                                                      this = (runtime_error *)
                                                             __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                (this,"symbol not found");
                                                    }
                                                    else {
                                                      iVar1 = uv_dlsym(&oclLib,"clRetainProgram",
                                                                       &pRetainProgram);
                                                      if (iVar1 == -1) {
                                                        this = (runtime_error *)
                                                               __cxa_allocate_exception(0x10);
                                                        std::runtime_error::runtime_error
                                                                  (this,"symbol not found");
                                                      }
                                                      else {
                                                        iVar1 = uv_dlsym(&oclLib,"clRetainMemObject"
                                                                         ,&pRetainMemObject);
                                                        if (iVar1 != -1) {
                                                          uv_dlsym(&oclLib,
                                                  "clCreateCommandQueueWithProperties",
                                                  &pCreateCommandQueueWithProperties);
                                                  return true;
                                                  }
                                                  this = (runtime_error *)
                                                         __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            (this,"symbol not found");
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool xmrig::OclLib::load()
{
    try {
        DLSYM(CreateCommandQueue);
        DLSYM(CreateContext);
        DLSYM(BuildProgram);
        DLSYM(EnqueueNDRangeKernel);
        DLSYM(EnqueueReadBuffer);
        DLSYM(EnqueueWriteBuffer);
        DLSYM(Finish);
        DLSYM(GetDeviceIDs);
        DLSYM(GetDeviceInfo);
        DLSYM(GetPlatformInfo);
        DLSYM(GetPlatformIDs);
        DLSYM(GetProgramBuildInfo);
        DLSYM(GetProgramInfo);
        DLSYM(SetKernelArg);
        DLSYM(CreateKernel);
        DLSYM(CreateBuffer);
        DLSYM(CreateProgramWithBinary);
        DLSYM(CreateProgramWithSource);
        DLSYM(ReleaseMemObject);
        DLSYM(ReleaseProgram);
        DLSYM(ReleaseKernel);
        DLSYM(ReleaseCommandQueue);
        DLSYM(ReleaseContext);
        DLSYM(GetKernelInfo);
        DLSYM(GetCommandQueueInfo);
        DLSYM(GetMemObjectInfo);
        DLSYM(GetContextInfo);
        DLSYM(ReleaseDevice);
        DLSYM(UnloadPlatformCompiler);
        DLSYM(SetMemObjectDestructorCallback);
        DLSYM(CreateSubBuffer);
        DLSYM(RetainProgram);
        DLSYM(RetainMemObject);
    } catch (std::exception &ex) {
        return false;
    }

#   if defined(CL_VERSION_2_0)
    uv_dlsym(&oclLib, kCreateCommandQueueWithProperties, reinterpret_cast<void**>(&pCreateCommandQueueWithProperties));
#   endif

    return true;
}